

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.hpp
# Opt level: O3

uint Lib::StackHash<Lib::StlHash>::
     hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
               (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s,
               uint hash)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  size_t sVar2;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *x;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *x_00;
  ulong uVar3;
  hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_21;
  
  uVar3 = (ulong)hash;
  x_00 = s->_stack;
  pMVar1 = s->_cursor;
  if (x_00 != pMVar1) {
    do {
      sVar2 = std::hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
              operator()(&local_21,x_00);
      hash = (int)sVar2 + (int)(uVar3 >> 2) + (uint)uVar3 * 0x40 + 0x9e3779b9 ^ (uint)uVar3;
      x_00 = x_00 + 1;
      uVar3 = (ulong)hash;
    } while (x_00 != pMVar1);
  }
  return hash;
}

Assistant:

static unsigned hash(const Stack<T>& s, unsigned hash = FNV32_OFFSET_BASIS) {
    for (auto& x : s) {
      hash = HashUtils::combine(hash, ElementHash::hash(x));
    }
    return hash;
  }